

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stripctrl.c
# Opt level: O0

void stripctrl_check_line_limit(StripCtrlCharsImpl *scc,wchar_t wc,size_t width)

{
  BinarySink *pBVar1;
  ptrlen pVar2;
  size_t width_local;
  wchar_t wc_local;
  StripCtrlCharsImpl *scc_local;
  
  if ((scc->line_limit & 1U) != 0) {
    if ((scc->line_start & 1U) != 0) {
      pBVar1 = scc->bs_out->binarysink_;
      pVar2 = make_ptrlen("| ",2);
      BinarySink_put_datapl(pBVar1,pVar2);
      scc->line_start = false;
      scc->line_chars_remaining = 0x4d;
    }
    if (wc == L'\n') {
      scc->line_start = true;
    }
    else {
      if (scc->line_chars_remaining < width) {
        pBVar1 = scc->bs_out->binarysink_;
        pVar2 = make_ptrlen("\r\n> ",4);
        BinarySink_put_datapl(pBVar1,pVar2);
        scc->line_chars_remaining = 0x4d;
      }
      if (scc->line_chars_remaining < width) {
        __assert_fail("width <= scc->line_chars_remaining",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/stripctrl.c"
                      ,0x9c,"void stripctrl_check_line_limit(StripCtrlCharsImpl *, wchar_t, size_t)"
                     );
      }
      scc->line_chars_remaining = scc->line_chars_remaining - width;
    }
  }
  return;
}

Assistant:

static inline void stripctrl_check_line_limit(
    StripCtrlCharsImpl *scc, wchar_t wc, size_t width)
{
    if (!scc->line_limit)
        return;                        /* nothing to do */

    if (scc->line_start) {
        put_datapl(scc->bs_out, PTRLEN_LITERAL("| "));
        scc->line_start = false;
        scc->line_chars_remaining = LINE_LIMIT;
    }

    if (wc == '\n') {
        scc->line_start = true;
        return;
    }

    if (scc->line_chars_remaining < width) {
        put_datapl(scc->bs_out, PTRLEN_LITERAL("\r\n> "));
        scc->line_chars_remaining = LINE_LIMIT;
    }

    assert(width <= scc->line_chars_remaining);
    scc->line_chars_remaining -= width;
}